

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_prop_arrays.cpp
# Opt level: O2

Status __thiscall spvtools::opt::CopyPropagateArrays::Process(CopyPropagateArrays *this)

{
  Module *pMVar1;
  pointer puVar2;
  __uniq_ptr_data<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>,_true,_true>
  _Var3;
  long *plVar4;
  _Tuple_impl<0UL,_spvtools::opt::CopyPropagateArrays::MemoryObject_*,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
  _Var5;
  _Elt_pointer ppIVar6;
  Instruction *var_inst;
  bool bVar7;
  uint32_t uVar8;
  StorageClass SVar9;
  Instruction *in_RAX;
  Instruction *insertion_point;
  Status SVar10;
  vector<spvtools::opt::CopyPropagateArrays::AccessChainEntry,_std::allocator<spvtools::opt::CopyPropagateArrays::AccessChainEntry>_>
  *pvVar11;
  pointer puVar12;
  unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
  source_object;
  _Head_base<0UL,_spvtools::opt::CopyPropagateArrays::MemoryObject_*,_false> local_38;
  
  pMVar1 = (((this->super_MemPass).super_Pass.context_)->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  puVar2 = *(pointer *)
            ((long)&(pMVar1->functions_).
                    super__Vector_base<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>
            + 8);
  local_38._M_head_impl = (MemoryObject *)in_RAX;
  for (puVar12 = *(pointer *)
                  &(pMVar1->functions_).
                   super__Vector_base<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>
                   ._M_impl; puVar12 != puVar2; puVar12 = puVar12 + 1) {
    _Var3.
    super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>.
    _M_t.
    super__Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
    .super__Head_base<0UL,_spvtools::opt::Function_*,_false>._M_head_impl =
         (puVar12->_M_t).
         super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
    ;
    plVar4 = *(long **)((long)_Var3.
                              super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
                              .super__Head_base<0UL,_spvtools::opt::Function_*,_false>._M_head_impl
                       + 0x98);
    if (plVar4 != *(long **)((long)_Var3.
                                   super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
                                   .super__Head_base<0UL,_spvtools::opt::Function_*,_false>.
                                   _M_head_impl + 0xa0)) {
      pvVar11 = (vector<spvtools::opt::CopyPropagateArrays::AccessChainEntry,_std::allocator<spvtools::opt::CopyPropagateArrays::AccessChainEntry>_>
                 *)(*plVar4 + 0x20);
      while (_Var5.super__Head_base<0UL,_spvtools::opt::CopyPropagateArrays::MemoryObject_*,_false>.
             _M_head_impl = (_Head_base<0UL,_spvtools::opt::CopyPropagateArrays::MemoryObject_*,_false>
                             )(pvVar11->
                              super__Vector_base<spvtools::opt::CopyPropagateArrays::AccessChainEntry,_std::allocator<spvtools::opt::CopyPropagateArrays::AccessChainEntry>_>
                              )._M_impl.super__Vector_impl_data._M_start,
            *(int *)&(((vector<spvtools::opt::CopyPropagateArrays::AccessChainEntry,_std::allocator<spvtools::opt::CopyPropagateArrays::AccessChainEntry>_>
                        *)((long)_Var5.
                                 super__Head_base<0UL,_spvtools::opt::CopyPropagateArrays::MemoryObject_*,_false>
                                 ._M_head_impl + 0x28))->
                     super__Vector_base<spvtools::opt::CopyPropagateArrays::AccessChainEntry,_std::allocator<spvtools::opt::CopyPropagateArrays::AccessChainEntry>_>
                     )._M_impl.super__Vector_impl_data._M_start == 0x3b) {
        local_38._M_head_impl =
             (MemoryObject *)
             _Var5.super__Head_base<0UL,_spvtools::opt::CopyPropagateArrays::MemoryObject_*,_false>.
             _M_head_impl;
        std::deque<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>::
        emplace_back<spvtools::opt::Instruction*>
                  ((deque<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>> *
                   )&this->worklist_,(Instruction **)&stack0xffffffffffffffc8);
        pvVar11 = (vector<spvtools::opt::CopyPropagateArrays::AccessChainEntry,_std::allocator<spvtools::opt::CopyPropagateArrays::AccessChainEntry>_>
                   *)((long)_Var5.
                            super__Head_base<0UL,_spvtools::opt::CopyPropagateArrays::MemoryObject_*,_false>
                            ._M_head_impl + 8);
      }
    }
  }
  SVar10 = Failure;
  do {
    do {
      ppIVar6 = (this->worklist_).c.
                super__Deque_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur;
      if ((this->worklist_).c.
          super__Deque_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_cur == ppIVar6) {
        return SVar10 ^ SuccessWithoutChange;
      }
      var_inst = *ppIVar6;
      std::deque<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
      pop_front(&(this->worklist_).c);
      insertion_point = FindStoreInstruction(this,var_inst);
    } while (insertion_point == (Instruction *)0x0);
    FindSourceObjectIfPossible
              ((CopyPropagateArrays *)&stack0xffffffffffffffc8,(Instruction *)this,var_inst);
    if (local_38._M_head_impl != (MemoryObject *)0x0) {
      uVar8 = Instruction::type_id(var_inst);
      bVar7 = IsPointerToArrayType(this,uVar8);
      if (!bVar7) {
        SVar9 = MemoryObject::GetStorageClass(local_38._M_head_impl);
        if (SVar9 != Input) goto LAB_004cf01c;
      }
      uVar8 = MemoryObject::GetPointerTypeId(local_38._M_head_impl,this);
      bVar7 = CanUpdateUses(this,var_inst,uVar8);
      if (bVar7) {
        PropagateObject(this,var_inst,local_38._M_head_impl,insertion_point);
        SVar10 = 1;
      }
    }
LAB_004cf01c:
    std::
    unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
    ::~unique_ptr((unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
                   *)&stack0xffffffffffffffc8);
  } while( true );
}

Assistant:

Pass::Status CopyPropagateArrays::Process() {
  bool modified = false;
  for (Function& function : *get_module()) {
    if (function.IsDeclaration()) {
      continue;
    }

    BasicBlock* entry_bb = &*function.begin();

    for (auto var_inst = entry_bb->begin();
         var_inst->opcode() == spv::Op::OpVariable; ++var_inst) {
      worklist_.push(&*var_inst);
    }
  }

  while (!worklist_.empty()) {
    Instruction* var_inst = worklist_.front();
    worklist_.pop();

    // Find the only store to the entire memory location, if it exists.
    Instruction* store_inst = FindStoreInstruction(&*var_inst);

    if (!store_inst) {
      continue;
    }

    std::unique_ptr<MemoryObject> source_object =
        FindSourceObjectIfPossible(&*var_inst, store_inst);

    if (source_object != nullptr) {
      if (!IsPointerToArrayType(var_inst->type_id()) &&
          source_object->GetStorageClass() != spv::StorageClass::Input) {
        continue;
      }

      if (CanUpdateUses(&*var_inst, source_object->GetPointerTypeId(this))) {
        modified = true;

        PropagateObject(&*var_inst, source_object.get(), store_inst);
      }
    }
  }

  return (modified ? Status::SuccessWithChange : Status::SuccessWithoutChange);
}